

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void f_parser(lua_State *L,void *ud)

{
  size_t sVar1;
  ZIO *pZVar2;
  byte *pbVar3;
  global_State *pgVar4;
  StkId pTVar5;
  size_t l;
  char *pcVar6;
  GCObject *pGVar7;
  GCObject *pGVar8;
  ulong uVar9;
  LexState lexstate;
  LexState local_2d8;
  FuncState local_278;
  
  if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
    luaC_step(L);
  }
  local_2d8.buff = (Mbuffer *)((long)ud + 8);
  pZVar2 = *ud;
  pcVar6 = *(char **)((long)ud + 0x20);
  l = strlen(pcVar6);
  local_2d8.source = luaS_newlstr(L,pcVar6,l);
  local_2d8.decpoint = '.';
  local_2d8.lookahead.token = 0x11f;
  local_2d8.fs = (FuncState *)0x0;
  local_2d8.linenumber = 1;
  local_2d8.lastline = 1;
  local_2d8.L = L;
  local_2d8.z = pZVar2;
  pcVar6 = (char *)luaM_realloc_(L,(local_2d8.buff)->buffer,(local_2d8.buff)->buffsize,0x20);
  (local_2d8.buff)->buffer = pcVar6;
  (local_2d8.buff)->buffsize = 0x20;
  sVar1 = (local_2d8.z)->n;
  (local_2d8.z)->n = (local_2d8.z)->n - 1;
  if (sVar1 == 0) {
    local_2d8.current = luaZ_fill(local_2d8.z);
  }
  else {
    pbVar3 = (byte *)(local_2d8.z)->p;
    (local_2d8.z)->p = (char *)(pbVar3 + 1);
    local_2d8.current = (int)*pbVar3;
  }
  open_func(&local_2d8,&local_278);
  *(lu_byte *)((long)&(local_278.f)->nups + 2) = '\x02';
  local_2d8.lastline = local_2d8.linenumber;
  if (local_2d8.lookahead.token == 0x11f) {
    local_2d8.t.token = llex(&local_2d8,&local_2d8.t.seminfo);
  }
  else {
    local_2d8.t._4_4_ = local_2d8.lookahead._4_4_;
    local_2d8.t.token = local_2d8.lookahead.token;
    local_2d8.t.seminfo = local_2d8.lookahead.seminfo;
    local_2d8.lookahead.token = 0x11f;
  }
  chunk(&local_2d8);
  if (local_2d8.t.token == 0x11f) {
    close_func(&local_2d8);
    pGVar7 = (GCObject *)
             luaF_newLclosure(L,(uint)(byte)*(lu_mem *)&(local_278.f)->nups,&((L->l_gt).value.gc)->h
                             );
    (pGVar7->th).l_G = (global_State *)local_278.f;
    if ((lu_byte)*(lu_mem *)&(local_278.f)->nups != '\0') {
      uVar9 = 0;
      do {
        pGVar8 = (GCObject *)luaM_realloc_(L,(void *)0x0,0,0x28);
        pgVar4 = L->l_G;
        (pGVar8->gch).next = pgVar4->rootgc;
        pgVar4->rootgc = pGVar8;
        (pGVar8->gch).marked = pgVar4->currentwhite & 3;
        (pGVar8->gch).tt = '\n';
        (pGVar8->h).metatable = (Table *)&(pGVar8->h).array;
        *(undefined4 *)&(pGVar8->h).node = 0;
        *(GCObject **)((long)pGVar7 + uVar9 * 8 + 0x28) = pGVar8;
        uVar9 = uVar9 + 1;
      } while (uVar9 < (byte)*(lu_mem *)&(local_278.f)->nups);
    }
    pTVar5 = L->top;
    (pTVar5->value).gc = pGVar7;
    pTVar5->tt = 6;
    if ((long)L->stack_last - (long)L->top < 0x11) {
      luaD_growstack(L,1);
    }
    L->top = L->top + 1;
    return;
  }
  error_expected(&local_2d8,0x11f);
}

Assistant:

static void f_parser(lua_State*L,void*ud){
int i;
Proto*tf;
Closure*cl;
struct SParser*p=cast(struct SParser*,ud);
luaC_checkGC(L);
tf=luaY_parser(L,p->z,
&p->buff,p->name);
cl=luaF_newLclosure(L,tf->nups,hvalue(gt(L)));
cl->l.p=tf;
for(i=0;i<tf->nups;i++)
cl->l.upvals[i]=luaF_newupval(L);
setclvalue(L,L->top,cl);
incr_top(L);
}